

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_true,_false>::delete_sib_(DaTrie<true,_true,_false> *this,uint32_t node_pos)

{
  uint8_t uVar1;
  pointer pBVar2;
  Bc BVar3;
  pointer pNVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  
  uVar5 = (ulong)node_pos;
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar2 >> 3) <= uVar5) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x22f,
                  "void ddd::DaTrie<true, true, false>::delete_sib_(uint32_t) [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  BVar3 = pBVar2[uVar5];
  if ((long)BVar3 < 0) {
    uVar6 = (ulong)BVar3 >> 0x20 & 0x7fffffff;
    bVar7 = (byte)node_pos ^ SUB81(pBVar2[uVar6],0);
    pNVar4 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar9 = (&pNVar4->child)[(uint)(BVar3._4_4_ * 2)];
    do {
      uVar8 = (ulong)bVar9 ^ (ulong)pBVar2[uVar6] & 0x7fffffff;
      bVar9 = pNVar4[uVar8].sib;
    } while (bVar9 != bVar7);
    uVar1 = pNVar4[uVar5].sib;
    if ((&pNVar4->child)[(uint)(BVar3._4_4_ * 2)] == bVar7) {
      pNVar4[uVar6].child = uVar1;
    }
    pNVar4[uVar8].sib = uVar1;
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x230,
                "void ddd::DaTrie<true, true, false>::delete_sib_(uint32_t) [WithBLM = true, WithNLM = true, Prefix = false]"
               );
}

Assistant:

void delete_sib_(uint32_t node_pos) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto parent_pos = bc_[node_pos].check();
    auto base = bc_[parent_pos].base();
    auto label = static_cast<uint8_t>(base ^ node_pos);

    auto _node_pos = base ^node_links_[parent_pos].child;
    while (node_links_[_node_pos].sib != label) {
      _node_pos = base ^ node_links_[_node_pos].sib;
    }

    if (node_links_[parent_pos].child == node_links_[_node_pos].sib) {
      node_links_[parent_pos].child = node_links_[node_pos].sib;
    }
    node_links_[_node_pos].sib = node_links_[node_pos].sib;
  }